

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  anon_union_8192_4_fbc60714_for_scratch *result;
  ushort *puVar1;
  byte bVar2;
  byte bVar3;
  xml_encoding xVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  value_type puVar5;
  size_t i;
  anon_union_8192_4_fbc60714_for_scratch *paVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint32_t *dest;
  byte bVar14;
  
  if (size == 0) {
    return;
  }
  xVar4 = this->encoding;
  if (xVar4 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,UNRECOVERED_JUMPTABLE);
    return;
  }
  result = &this->scratch;
  if ((xVar4 & ~encoding_utf8) != encoding_utf16_le) {
    if (xVar4 - encoding_utf32_le < 2) {
      puVar5 = utf_decoder<pugi::impl::(anonymous_namespace)::utf32_writer,_pugi::impl::(anonymous_namespace)::opt_false>
               ::decode_utf8_block((uint8_t *)data,size,(value_type)result->data_u8);
      uVar7 = (long)puVar5 - (long)result->data_u8;
      if (xVar4 != encoding_utf32_le) {
        for (lVar11 = 0; (long)uVar7 >> 2 != lVar11; lVar11 = lVar11 + 1) {
          uVar8 = result->data_u32[lVar11];
          result->data_u32[lVar11] =
               uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        }
      }
LAB_0011c860:
      if (uVar7 < 0x2001) {
        (*this->writer->_vptr_xml_writer[2])(this->writer,result);
        return;
      }
      __assert_fail("result <= sizeof(scratch)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                    ,0xb1e,
                    "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
                   );
    }
    if (xVar4 != encoding_latin1) {
      __assert_fail("!\"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                    ,0xaf8,
                    "size_t pugi::impl::(anonymous namespace)::convert_buffer(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                   );
    }
    paVar6 = result;
LAB_0011c67d:
    do {
      puVar9 = (uint *)data;
      lVar10 = 0;
      lVar11 = 3;
      while( true ) {
        if (size + lVar10 == 0) {
          uVar7 = (long)paVar6 - (long)result->data_u8;
          goto LAB_0011c860;
        }
        bVar2 = *(byte *)((long)puVar9 + lVar11 + -3);
        if (-1 < (char)bVar2) {
          paVar6->data_u8[0] = bVar2;
          paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u8 + 1);
          data = (char_t *)((long)puVar9 + (1 - lVar10));
          size = (size + lVar10) - 1;
          if ((size < 4) || ((((int)puVar9 - (int)lVar10) + 1U & 3) != 0)) goto LAB_0011c67d;
          goto LAB_0011c791;
        }
        if ((((2 < size + lVar10) && ((bVar2 & 0xf0) == 0xe0)) &&
            (bVar14 = *(byte *)((long)puVar9 + lVar11 + -2), (bVar14 & 0xc0) == 0x80)) &&
           (bVar3 = *(byte *)((long)puVar9 + lVar11 + -1), (bVar3 & 0xc0) == 0x80)) break;
        lVar10 = lVar10 + -1;
        lVar11 = lVar11 + 1;
      }
      uVar8 = (uint)bVar14 << 6;
      bVar14 = bVar3 & 0x3f | (byte)uVar8;
      if ((uVar8 & 0xf00) != 0 || (bVar2 & 0xf) != 0) {
        bVar14 = 0x3f;
      }
      paVar6->data_u8[0] = bVar14;
      paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 1);
      size = (size + lVar10) - 3;
      data = (char_t *)((long)puVar9 + (3 - lVar10));
    } while( true );
  }
  paVar6 = result;
LAB_0011c3c8:
  do {
    puVar9 = (uint *)data;
    lVar10 = 0;
    lVar11 = 3;
    while( true ) {
      uVar7 = size + lVar10;
      if (uVar7 == 0) {
        uVar7 = (long)paVar6 - (long)result->data_u8;
        if (xVar4 != encoding_utf16_le) {
          for (lVar11 = 0; (long)uVar7 >> 1 != lVar11; lVar11 = lVar11 + 1) {
            puVar1 = result->data_u16 + lVar11;
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          }
        }
        goto LAB_0011c860;
      }
      bVar2 = *(byte *)((long)puVar9 + lVar11 + -3);
      uVar8 = (uint)bVar2;
      if (-1 < (char)bVar2) {
        *(ushort *)paVar6 = (ushort)bVar2;
        paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u16 + 1);
        data = (char_t *)((long)puVar9 + (1 - lVar10));
        size = (size + lVar10) - 1;
        if ((size < 4) || ((((int)puVar9 - (int)lVar10) + 1U & 3) != 0)) goto LAB_0011c3c8;
        goto LAB_0011c4f4;
      }
      if (((uVar7 != 1) && ((uVar8 & 0xffffffe0) == 0xc0)) &&
         (bVar14 = *(byte *)((long)puVar9 + lVar11 + -2), (bVar14 & 0xc0) == 0x80)) {
        paVar6->data_u16[0] = bVar14 & 0x3f | (ushort)((uVar8 & 0x1f) << 6);
        paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 2);
        size = (size + lVar10) - 2;
        data = (char_t *)((long)puVar9 + (2 - lVar10));
        goto LAB_0011c3c8;
      }
      if ((((2 < uVar7) && ((uVar8 & 0xfffffff0) == 0xe0)) &&
          (bVar14 = *(byte *)((long)puVar9 + lVar11 + -2), (bVar14 & 0xc0) == 0x80)) &&
         (bVar3 = *(byte *)((long)puVar9 + lVar11 + -1), (bVar3 & 0xc0) == 0x80)) {
        paVar6->data_u16[0] = bVar3 & 0x3f | (bVar14 & 0x3f) << 6 | (ushort)bVar2 << 0xc;
        paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 2);
        size = (size + lVar10) - 3;
        data = (char_t *)((long)puVar9 + (3 - lVar10));
        goto LAB_0011c3c8;
      }
      if (((3 < uVar7) && ((uVar8 & 0xfffffff8) == 0xf0)) &&
         ((uVar12 = (uint)*(byte *)((long)puVar9 + lVar11 + -2), (uVar12 & 0xffffffc0) == 0x80 &&
          ((bVar2 = *(byte *)((long)puVar9 + lVar11 + -1), (bVar2 & 0xc0) == 0x80 &&
           (bVar14 = *(byte *)((long)puVar9 + lVar11), (bVar14 & 0xc0) == 0x80)))))) break;
      lVar10 = lVar10 + -1;
      lVar11 = lVar11 + 1;
    }
    uVar13 = (uint)bVar2 << 6;
    paVar6->data_u16[0] =
         (short)((uVar13 & 0xc00) + ((uVar12 & 0x3f) << 0xc | (uVar8 & 7) << 0x12) + 0x3ff0000 >> 10
                ) + 0xd800;
    paVar6->data_u16[1] = bVar14 & 0x3f | (ushort)uVar13 & 0x3ff | 0xdc00;
    paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 4);
    size = (size + lVar10) - 4;
    data = (char_t *)((long)puVar9 + (4 - lVar10));
  } while( true );
  while( true ) {
    paVar6->data_u8[0] = (byte)*(uint *)data;
    paVar6->data_u8[1] = *(byte *)((long)data + 1);
    paVar6->data_u8[2] = *(byte *)((long)data + 2);
    paVar6->data_u8[3] = *(byte *)((long)data + 3);
    paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u8 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_0011c791:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_0011c67d;
  while( true ) {
    paVar6->data_u16[0] = (ushort)*(uint *)data & 0x7f;
    *(ushort *)((long)paVar6 + 2) = (ushort)*(byte *)((long)data + 1);
    *(ushort *)((long)paVar6 + 4) = (ushort)*(byte *)((long)data + 2);
    *(ushort *)((long)paVar6 + 6) = (ushort)*(byte *)((long)data + 3);
    paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u16 + 4);
    data = (char_t *)((long)data + 4);
    size = size - 4;
    if (size < 4) break;
LAB_0011c4f4:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_0011c3c8;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}